

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O2

int __thiscall BoothFunctor::operator()(BoothFunctor *this,VectorXd *z,VectorXd *fvec)

{
  double dVar1;
  double dVar2;
  CoeffReturnType pdVar3;
  Scalar *pSVar4;
  
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)z,0);
  dVar1 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)z,1);
  dVar2 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)fvec,0);
  *pSVar4 = dVar2 + dVar2 + dVar1 + -7.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)fvec,1);
  *pSVar4 = dVar1 + dVar1 + dVar2 + -5.0;
  return 0;
}

Assistant:

int operator()(const Eigen::VectorXd &z, Eigen::VectorXd &fvec) const
    {
        double x = z(0);   double y = z(1);
        /*
        * Evaluate the Booth function.
        * Important: LevenbergMarquardt is designed to work with objective functions that are a sum
        * of squared terms. The algorithm takes this into account: do not do it yourself.
        * In other words: objFun = sum(fvec(i)^2)
        */
        fvec(0) = x + 2*y - 7;
        fvec(1) = 2*x + y - 5;
        return 0;
    }